

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void process(lzma_check_state *check)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t i;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint unaff_EBP;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint in_R8D;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint uVar22;
  uint32_t uVar23;
  uint uVar24;
  uint uVar25;
  ulong unaff_R15;
  uint32_t data [16];
  uint local_158;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_78 [18];
  
  lVar10 = 0;
  do {
    uVar1 = (check->buffer).u32[lVar10];
    local_78[lVar10] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10);
  uVar1 = (check->state).sha256.state[1];
  uVar2 = (check->state).sha256.state[2];
  uVar3 = (check->state).sha256.state[3];
  uVar4 = (check->state).sha256.state[4];
  uVar5 = (check->state).sha256.state[5];
  uVar6 = (check->state).sha256.state[6];
  uVar7 = (check->state).sha256.state[7];
  uVar18 = 0xfffffffffffffff0;
  uVar14 = (check->state).crc32;
  uVar9 = uVar1;
  uVar8 = uVar2;
  uVar11 = uVar3;
  uVar20 = uVar4;
  uVar23 = uVar5;
  uVar21 = uVar6;
  uVar17 = uVar7;
  uVar15 = uVar1;
  do {
    uVar19 = (uint)unaff_R15;
    uVar16 = local_78[2];
    uVar13 = local_78[0];
    uVar24 = local_78[1];
    if (uVar18 != 0xfffffffffffffff0) {
      uVar13 = unaff_EBP + local_158 +
               ((uint)(unaff_R15 >> 3) & 0x1fffffff ^
               (uVar19 << 0xe | uVar19 >> 0x12) ^ (uVar19 << 0x19 | uVar19 >> 7)) +
               (local_140 >> 10 ^
               (local_140 << 0xd | local_140 >> 0x13) ^ (local_140 << 0xf | local_140 >> 0x11));
      uVar24 = uVar19 + local_150 +
               (in_R8D >> 3 ^ (in_R8D << 0xe | in_R8D >> 0x12) ^ (in_R8D << 0x19 | in_R8D >> 7)) +
               (local_104 >> 10 ^
               (local_104 << 0xd | local_104 >> 0x13) ^ (local_104 << 0xf | local_104 >> 0x11));
      uVar16 = in_R8D + local_14c +
               (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7)) +
               (uVar13 >> 10 ^
               (uVar13 * 0x2000 | uVar13 >> 0x13) ^ (uVar13 * 0x8000 | uVar13 >> 0x11));
    }
    unaff_EBP = uVar13;
    in_R8D = uVar16;
    local_124 = local_78[3];
    if (uVar18 != 0xfffffffffffffff0) {
      local_124 = uVar9 + local_148 +
                  (local_114 >> 3 ^
                  (local_114 << 0xe | local_114 >> 0x12) ^ (local_114 << 0x19 | local_114 >> 7)) +
                  (uVar24 >> 10 ^
                  (uVar24 << 0xd | uVar24 >> 0x13) ^ (uVar24 << 0xf | uVar24 >> 0x11));
    }
    local_128 = local_78[4];
    if (uVar18 != 0xfffffffffffffff0) {
      local_128 = local_114 + local_144 +
                  (local_110 >> 3 ^
                  (local_110 << 0xe | local_110 >> 0x12) ^ (local_110 << 0x19 | local_110 >> 7)) +
                  (in_R8D >> 10 ^
                  (in_R8D << 0xd | in_R8D >> 0x13) ^ (in_R8D << 0xf | in_R8D >> 0x11));
    }
    local_12c = local_78[5];
    if (uVar18 != 0xfffffffffffffff0) {
      local_12c = local_110 + local_140 +
                  (local_10c >> 3 ^
                  (local_10c << 0xe | local_10c >> 0x12) ^ (local_10c << 0x19 | local_10c >> 7)) +
                  (local_124 >> 10 ^
                  (local_124 << 0xd | local_124 >> 0x13) ^ (local_124 << 0xf | local_124 >> 0x11));
    }
    local_130 = local_78[6];
    if (uVar18 != 0xfffffffffffffff0) {
      local_130 = local_10c + local_104 +
                  (local_108 >> 3 ^
                  (local_108 << 0xe | local_108 >> 0x12) ^ (local_108 << 0x19 | local_108 >> 7)) +
                  (local_128 >> 10 ^
                  (local_128 << 0xd | local_128 >> 0x13) ^ (local_128 << 0xf | local_128 >> 0x11));
    }
    local_134 = local_78[7];
    if (uVar18 != 0xfffffffffffffff0) {
      local_134 = local_108 + unaff_EBP +
                  (local_13c >> 3 ^
                  (local_13c << 0xe | local_13c >> 0x12) ^ (local_13c << 0x19 | local_13c >> 7)) +
                  (local_12c >> 10 ^
                  (local_12c << 0xd | local_12c >> 0x13) ^ (local_12c << 0xf | local_12c >> 0x11));
    }
    local_138 = local_78[8];
    if (uVar18 != 0xfffffffffffffff0) {
      local_138 = local_13c + uVar24 +
                  (local_158 >> 3 ^
                  (local_158 << 0xe | local_158 >> 0x12) ^ (local_158 << 0x19 | local_158 >> 7)) +
                  (local_130 >> 10 ^
                  (local_130 << 0xd | local_130 >> 0x13) ^ (local_130 << 0xf | local_130 >> 0x11));
    }
    local_f0 = local_78[9];
    if (uVar18 != 0xfffffffffffffff0) {
      local_f0 = local_158 + in_R8D +
                 (local_150 >> 3 ^
                 (local_150 << 0xe | local_150 >> 0x12) ^ (local_150 << 0x19 | local_150 >> 7)) +
                 (local_134 >> 10 ^
                 (local_134 << 0xd | local_134 >> 0x13) ^ (local_134 << 0xf | local_134 >> 0x11));
    }
    local_f4 = local_78[10];
    if (uVar18 != 0xfffffffffffffff0) {
      local_f4 = local_150 + local_124 +
                 (local_14c >> 3 ^
                 (local_14c << 0xe | local_14c >> 0x12) ^ (local_14c << 0x19 | local_14c >> 7)) +
                 (local_138 >> 10 ^
                 (local_138 << 0xd | local_138 >> 0x13) ^ (local_138 << 0xf | local_138 >> 0x11));
    }
    local_f8 = local_78[0xb];
    if (uVar18 != 0xfffffffffffffff0) {
      local_f8 = local_14c + local_128 +
                 (local_148 >> 3 ^
                 (local_148 << 0xe | local_148 >> 0x12) ^ (local_148 << 0x19 | local_148 >> 7)) +
                 (local_f0 >> 10 ^
                 (local_f0 << 0xd | local_f0 >> 0x13) ^ (local_f0 << 0xf | local_f0 >> 0x11));
    }
    local_fc = local_78[0xc];
    if (uVar18 != 0xfffffffffffffff0) {
      local_fc = local_148 + local_12c +
                 (local_144 >> 3 ^
                 (local_144 << 0xe | local_144 >> 0x12) ^ (local_144 << 0x19 | local_144 >> 7)) +
                 (local_f4 >> 10 ^
                 (local_f4 << 0xd | local_f4 >> 0x13) ^ (local_f4 << 0xf | local_f4 >> 0x11));
    }
    local_100 = local_78[0xd];
    if (uVar18 != 0xfffffffffffffff0) {
      local_100 = local_144 + local_130 +
                  (local_140 >> 3 ^
                  (local_140 << 0xe | local_140 >> 0x12) ^ (local_140 << 0x19 | local_140 >> 7)) +
                  (local_f8 >> 10 ^
                  (local_f8 << 0xd | local_f8 >> 0x13) ^ (local_f8 << 0xf | local_f8 >> 0x11));
    }
    uVar16 = local_78[0xe];
    if (uVar18 != 0xfffffffffffffff0) {
      uVar16 = local_140 + local_134 +
               (local_104 >> 3 ^
               (local_104 << 0xe | local_104 >> 0x12) ^ (local_104 << 0x19 | local_104 >> 7)) +
               (local_fc >> 10 ^
               (local_fc << 0xd | local_fc >> 0x13) ^ (local_fc << 0xf | local_fc >> 0x11));
    }
    uVar13 = local_78[0xf];
    if (uVar18 != 0xfffffffffffffff0) {
      uVar13 = local_104 + local_138 +
               (unaff_EBP >> 3 ^
               (unaff_EBP << 0xe | unaff_EBP >> 0x12) ^ (unaff_EBP << 0x19 | unaff_EBP >> 7)) +
               (local_100 >> 10 ^
               (local_100 << 0xd | local_100 >> 0x13) ^ (local_100 << 0xf | local_100 >> 0x11));
    }
    iVar12 = ((uVar21 ^ uVar23) & uVar20 ^ uVar21) +
             ((uVar20 << 7 | uVar20 >> 0x19) ^
             (uVar20 << 0x15 | uVar20 >> 0xb) ^ (uVar20 << 0x1a | uVar20 >> 6)) + uVar17 +
             SHA256_K[uVar18 + 0x10] + unaff_EBP;
    uVar11 = uVar11 + iVar12;
    uVar17 = ((uVar15 | uVar14) & uVar8 | uVar15 & uVar14) +
             ((uVar14 << 10 | uVar14 >> 0x16) ^
             (uVar14 << 0x13 | uVar14 >> 0xd) ^ (uVar14 << 0x1e | uVar14 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x11] + uVar21 + ((uVar23 ^ uVar20) & uVar11 ^ uVar23) + uVar24 +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar8 = uVar8 + iVar12;
    uVar25 = ((uVar17 | uVar14) & uVar15 | uVar17 & uVar14) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x12] + uVar23 + ((uVar11 ^ uVar20) & uVar8 ^ uVar20) + in_R8D +
             ((uVar8 * 0x80 | uVar8 >> 0x19) ^
             (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
    uVar15 = uVar15 + iVar12;
    uVar22 = ((uVar25 | uVar17) & uVar14 | uVar25 & uVar17) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x13] + uVar20 + ((uVar8 ^ uVar11) & uVar15 ^ uVar11) + local_124 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    uVar14 = uVar14 + iVar12;
    uVar19 = ((uVar22 | uVar25) & uVar17 | uVar22 & uVar25) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x14] + uVar11 + ((uVar15 ^ uVar8) & uVar14 ^ uVar8) + local_128 +
             ((uVar14 * 0x80 | uVar14 >> 0x19) ^
             (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6));
    uVar17 = uVar17 + iVar12;
    uVar11 = ((uVar19 | uVar22) & uVar25 | uVar19 & uVar22) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x15] + uVar8 + ((uVar14 ^ uVar15) & uVar17 ^ uVar15) + local_12c +
             ((uVar17 * 0x80 | uVar17 >> 0x19) ^
             (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    uVar25 = uVar25 + iVar12;
    uVar9 = ((uVar11 | uVar19) & uVar22 | uVar11 & uVar19) +
            ((uVar11 * 0x400 | uVar11 >> 0x16) ^
            (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x16] + uVar15 + ((uVar17 ^ uVar14) & uVar25 ^ uVar14) + local_130 +
             ((uVar25 * 0x80 | uVar25 >> 0x19) ^
             (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6));
    uVar22 = uVar22 + iVar12;
    uVar15 = ((uVar9 | uVar11) & uVar19 | uVar9 & uVar11) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x17] + uVar14 + ((uVar25 ^ uVar17) & uVar22 ^ uVar17) + local_134 +
             ((uVar22 * 0x80 | uVar22 >> 0x19) ^
             (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
    uVar19 = uVar19 + iVar12;
    uVar14 = ((uVar15 | uVar9) & uVar11 | uVar15 & uVar9) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x18] + uVar17 + ((uVar22 ^ uVar25) & uVar19 ^ uVar25) + local_138 +
             ((uVar19 * 0x80 | uVar19 >> 0x19) ^
             (uVar19 * 0x200000 | uVar19 >> 0xb) ^ (uVar19 * 0x4000000 | uVar19 >> 6));
    uVar11 = uVar11 + iVar12;
    uVar17 = ((uVar14 | uVar15) & uVar9 | uVar14 & uVar15) +
             ((uVar14 * 0x400 | uVar14 >> 0x16) ^
             (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x19] + uVar25 + ((uVar19 ^ uVar22) & uVar11 ^ uVar22) + local_f0 +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar9 = uVar9 + iVar12;
    uVar8 = ((uVar17 | uVar14) & uVar15 | uVar17 & uVar14) +
            ((uVar17 * 0x400 | uVar17 >> 0x16) ^
            (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x1a] + uVar22 + ((uVar11 ^ uVar19) & uVar9 ^ uVar19) + local_f4 +
             ((uVar9 * 0x80 | uVar9 >> 0x19) ^
             (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6));
    uVar15 = uVar15 + iVar12;
    uVar22 = ((uVar8 | uVar17) & uVar14 | uVar8 & uVar17) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x1b] + uVar19 + ((uVar9 ^ uVar11) & uVar15 ^ uVar11) + local_f8 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    uVar14 = uVar14 + iVar12;
    uVar19 = ((uVar22 | uVar8) & uVar17 | uVar22 & uVar8) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x1c] + uVar11 + ((uVar15 ^ uVar9) & uVar14 ^ uVar9) + local_fc +
             ((uVar14 * 0x80 | uVar14 >> 0x19) ^
             (uVar14 * 0x200000 | uVar14 >> 0xb) ^ (uVar14 * 0x4000000 | uVar14 >> 6));
    uVar17 = uVar17 + iVar12;
    uVar11 = ((uVar19 | uVar22) & uVar8 | uVar19 & uVar22) +
             ((uVar19 * 0x400 | uVar19 >> 0x16) ^
             (uVar19 * 0x80000 | uVar19 >> 0xd) ^ (uVar19 * 0x40000000 | uVar19 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x1d] + uVar9 + ((uVar14 ^ uVar15) & uVar17 ^ uVar15) + local_100 +
             ((uVar17 * 0x80 | uVar17 >> 0x19) ^
             (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    uVar21 = uVar8 + iVar12;
    uVar8 = ((uVar11 | uVar19) & uVar22 | uVar11 & uVar19) +
            ((uVar11 * 0x400 | uVar11 >> 0x16) ^
            (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x1e] + uVar15 + ((uVar17 ^ uVar14) & uVar21 ^ uVar14) + uVar16 +
             ((uVar21 * 0x80 | uVar21 >> 0x19) ^
             (uVar21 * 0x200000 | uVar21 >> 0xb) ^ (uVar21 * 0x4000000 | uVar21 >> 6));
    uVar23 = uVar22 + iVar12;
    uVar15 = ((uVar8 | uVar11) & uVar19 | uVar8 & uVar11) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar12;
    iVar12 = SHA256_K[uVar18 + 0x1f] + uVar14 + ((uVar21 ^ uVar17) & uVar23 ^ uVar17) + uVar13 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar20 = uVar19 + iVar12;
    uVar14 = ((uVar15 | uVar8) & uVar11 | uVar15 & uVar8) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar12;
    uVar18 = uVar18 + 0x10;
    unaff_R15 = (ulong)uVar24;
    local_114 = local_128;
    local_110 = local_12c;
    local_10c = local_130;
    local_108 = local_134;
    local_13c = local_138;
    local_158 = local_f0;
    local_150 = local_f4;
    local_14c = local_f8;
    local_148 = local_fc;
    local_144 = local_100;
    uVar9 = local_124;
    local_140 = uVar16;
    local_104 = uVar13;
  } while (uVar18 < 0x30);
  (check->state).crc32 = uVar14 + (check->state).crc32;
  (check->state).sha256.state[1] = uVar15 + uVar1;
  (check->state).sha256.state[2] = uVar8 + uVar2;
  (check->state).sha256.state[3] = uVar11 + uVar3;
  (check->state).sha256.state[4] = uVar20 + uVar4;
  (check->state).sha256.state[5] = uVar23 + uVar5;
  (check->state).sha256.state[6] = uVar21 + uVar6;
  (check->state).sha256.state[7] = uVar17 + uVar7;
  return;
}

Assistant:

static void
process(lzma_check_state *check)
{
#ifdef WORDS_BIGENDIAN
	transform(check->state.sha256.state, check->buffer.u32);

#else
	uint32_t data[16];
	size_t i;

	for (i = 0; i < 16; ++i)
		data[i] = bswap32(check->buffer.u32[i]);

	transform(check->state.sha256.state, data);
#endif

	return;
}